

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::chained_buffer::append_buffer<libtorrent::span<char>>
          (chained_buffer *this,span<char> buffer,int used_size)

{
  _Elt_pointer pbVar1;
  
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::emplace_back<>(&this->m_vec);
  pbVar1 = (this->m_vec).
           super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar1 == (this->m_vec).
                super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar1 = (this->m_vec).
             super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 8;
  }
  pbVar1[-1].buf = buffer.m_ptr;
  pbVar1[-1].size = (int)buffer.m_len;
  pbVar1[-1].used_size = used_size;
  pbVar1[-1].destruct_holder =
       init_buffer_entry<libtorrent::span<char>_>::anon_class_1_0_00000001::__invoke;
  *(char **)pbVar1[-1].holder._M_elems = buffer.m_ptr;
  *(difference_type *)(pbVar1[-1].holder._M_elems + 8) = buffer.m_len;
  this->m_bytes = this->m_bytes + used_size;
  this->m_capacity = this->m_capacity + (int)buffer.m_len;
  return;
}

Assistant:

void append_buffer(Holder buffer, int used_size)
		{
			TORRENT_ASSERT(is_single_thread());
			TORRENT_ASSERT(int(buffer.size()) >= used_size);
			m_vec.emplace_back();
			buffer_t& b = m_vec.back();
			init_buffer_entry<Holder>(b, std::move(buffer), used_size);
		}